

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

shared_ptr<embree::Texture> __thiscall embree::Parms::getTexture(Parms *this,char *name)

{
  long lVar1;
  const_iterator cVar2;
  char *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<embree::Texture> sVar4;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,in_RDX,&local_39);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
                  *)name,&local_38);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
    _Var3._M_pi = extraout_RDX_00;
  }
  if ((cVar2._M_node == (_Base_ptr)(name + 8)) || (cVar2._M_node[2]._M_color != 0xe)) {
    *(undefined8 *)&(this->m)._M_t._M_impl = 0;
    *(undefined8 *)&(this->m)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    *(_Base_ptr *)&(this->m)._M_t._M_impl = cVar2._M_node[3]._M_right;
    lVar1 = *(long *)(cVar2._M_node + 4);
    *(long *)&(this->m)._M_t._M_impl.super__Rb_tree_header._M_header = lVar1;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
  }
  sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<embree::Texture>)
         sVar4.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> getTexture(const char* name) const {
      std::map<std::string,Variant>::const_iterator i = m.find(name);
      if (i == m.end() || (*i).second.type != Variant::TEXTURE) return std::shared_ptr<Texture>();
      return (*i).second.getTexture();
    }